

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t parse_htime_item(archive_read *a,char unix_time,int64_t *sec,uint32_t *nsec,
                        int64_t *extra_data_size)

{
  char cVar1;
  wchar_t extraout_EAX;
  wchar_t wVar2;
  uchar *p;
  undefined7 extraout_var;
  uint64_t *puVar3;
  int64_t iVar4;
  uint64_t unaff_R13;
  uint32_t time_val;
  ssize_t avail;
  wchar_t local_34;
  ssize_t local_30;
  
  if (unix_time == '\0') {
    local_30 = -1;
    puVar3 = (uint64_t *)__archive_read_ahead(a,8,&local_30);
    if (puVar3 == (uint64_t *)0x0) {
      wVar2 = L'\x01';
    }
    else {
      unaff_R13 = *puVar3;
      iVar4 = __archive_read_consume(a,8);
      wVar2 = (wchar_t)CONCAT71((int7)((ulong)iVar4 >> 8),iVar4 != 8);
    }
    if ((char)wVar2 == '\0') {
      ntfs_to_unix(unaff_R13,sec,nsec);
      *extra_data_size = *extra_data_size + -8;
      wVar2 = extraout_EAX;
    }
  }
  else {
    cVar1 = read_u32(a,(uint32_t *)&local_34);
    wVar2 = (wchar_t)CONCAT71(extraout_var,cVar1);
    if (cVar1 != '\0') {
      *extra_data_size = *extra_data_size + -4;
      *sec = (ulong)(uint)local_34;
      wVar2 = local_34;
    }
  }
  return wVar2;
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    int64_t* sec, uint32_t* nsec, int64_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*sec = (int64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		ntfs_to_unix(windows_time, sec, nsec);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}